

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void prf_state_push(prf_state_t *state)

{
  matrix4x4_f32_t *paafVar1;
  matrix4x4_f32_t *paafVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ushort uVar10;
  int iVar11;
  void *elem;
  matrix4x4_f32_t **ppaafVar12;
  
  uVar10 = state->state_push_level + 1;
  state->state_push_level = uVar10;
  prf_debug(1,"state pushed to level %d",(ulong)uVar10);
  iVar11 = prf_array_count(state->matrix);
  uVar10 = state->state_push_level;
  if ((int)(uint)uVar10 < iVar11) {
    ppaafVar12 = state->matrix;
  }
  else {
    elem = malloc(0x40);
    if (elem == (void *)0x0) {
      prf_state_reset(state);
      return;
    }
    ppaafVar12 = (matrix4x4_f32_t **)prf_array_append_ptr(state->matrix,elem);
    state->matrix = ppaafVar12;
    uVar10 = state->state_push_level;
  }
  paafVar1 = ppaafVar12[(ulong)uVar10 - 1];
  paafVar2 = ppaafVar12[uVar10];
  uVar3 = *(undefined8 *)(*paafVar1)[0];
  uVar4 = *(undefined8 *)((*paafVar1)[0] + 2);
  uVar5 = *(undefined8 *)(*paafVar1)[1];
  uVar6 = *(undefined8 *)((*paafVar1)[1] + 2);
  uVar7 = *(undefined8 *)(*paafVar1)[2];
  uVar8 = *(undefined8 *)((*paafVar1)[2] + 2);
  uVar9 = *(undefined8 *)((*paafVar1)[3] + 2);
  *(undefined8 *)(*paafVar2)[3] = *(undefined8 *)(*paafVar1)[3];
  *(undefined8 *)((*paafVar2)[3] + 2) = uVar9;
  *(undefined8 *)(*paafVar2)[2] = uVar7;
  *(undefined8 *)((*paafVar2)[2] + 2) = uVar8;
  *(undefined8 *)(*paafVar2)[1] = uVar5;
  *(undefined8 *)((*paafVar2)[1] + 2) = uVar6;
  *(undefined8 *)(*paafVar2)[0] = uVar3;
  *(undefined8 *)((*paafVar2)[0] + 2) = uVar4;
  return;
}

Assistant:

void
prf_state_push(
    prf_state_t * state )
{
    assert( state != NULL );

    state->state_push_level++;
    prf_debug( 1, "state pushed to level %d", state->state_push_level );
    if ( prf_array_count( state->matrix ) <= state->state_push_level ) {
        matrix4x4_f32_t * m;
        m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
        if ( m == NULL ) {
            prf_state_reset( state );
            return;
        }
        state->matrix = 
	  (matrix4x4_f32_t **)prf_array_append_ptr( state->matrix, m );
    }
    memcpy( state->matrix[ state->state_push_level ],
        state->matrix[ state->state_push_level - 1 ], sizeof( matrix4x4_f32_t ) );
}